

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O3

void BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,Command *cmds,
               size_t num_commands,ContextType literal_context_mode,
               BlockSplitFromDecoder *literals_block_splits_decoder,size_t *current_block_literals,
               BlockSplitFromDecoder *cmds_block_splits_decoder,size_t *current_block_cmds,
               MetaBlockSplit *mb)

{
  BrotliDistanceParams *pBVar1;
  uint32_t *puVar2;
  BlockSplit *dist_split;
  uint32_t uVar3;
  undefined1 auVar4 [16];
  uint32_t uVar5;
  int iVar6;
  BrotliDistanceParams *new_params_00;
  ContextType *context_modes;
  HistogramCommand *insert_and_copy_histograms;
  size_t sVar7;
  uint32_t *puVar8;
  HistogramLiteral *pHVar9;
  HistogramDistance *pHVar10;
  byte bVar11;
  ulong uVar12;
  uint32_t *puVar13;
  ulong uVar14;
  uint32_t ndirect;
  size_t sVar15;
  uint16_t *puVar16;
  uint uVar17;
  ulong uVar18;
  uint32_t uVar19;
  size_t sVar20;
  uint uVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  HistogramDistance *local_1e0;
  HistogramLiteral *local_1d8;
  double local_1c8;
  double dist_cost;
  BrotliEncoderParams new_params;
  BrotliEncoderParams orig_params;
  long lVar27;
  
  memcpy(&orig_params,params,0x90);
  memcpy(&new_params,params,0x90);
  uVar5 = orig_params.dist.num_direct_distance_codes;
  uVar3 = orig_params.dist.distance_postfix_bits;
  new_params_00 = (BrotliDistanceParams *)(ulong)orig_params.dist.num_direct_distance_codes;
  pBVar1 = &params->dist;
  uVar21 = 0;
  bVar24 = true;
  local_1c8 = 1e+99;
  uVar19 = 0;
  do {
    if (uVar21 < 0x10) {
      do {
        ndirect = uVar21 << ((byte)uVar19 & 0x1f);
        BrotliInitDistanceParams(&new_params,uVar19,ndirect);
        if (ndirect == uVar5 && uVar19 == uVar3) {
          bVar24 = false;
        }
        iVar6 = ComputeDistanceCost(cmds,num_commands,(BrotliDistanceParams *)(ulong)uVar3,
                                    new_params_00,(double *)&new_params.dist);
        if ((iVar6 == 0) || (local_1c8 < dist_cost)) {
          bVar23 = uVar21 == 0;
          uVar21 = uVar21 - 1 >> 1;
          if (bVar23) {
            uVar21 = 0;
          }
          goto LAB_001350c9;
        }
        (params->dist).max_distance = new_params.dist.max_distance;
        pBVar1->distance_postfix_bits = new_params.dist.distance_postfix_bits;
        pBVar1->num_direct_distance_codes = new_params.dist.num_direct_distance_codes;
        (params->dist).alphabet_size_max = new_params.dist.alphabet_size_max;
        (params->dist).alphabet_size_limit = new_params.dist.alphabet_size_limit;
        uVar21 = uVar21 + 1;
        local_1c8 = dist_cost;
      } while (uVar21 != 0x10);
      uVar21 = 0x10;
      local_1c8 = dist_cost;
    }
    uVar21 = uVar21 - 1 >> 1;
LAB_001350c9:
    uVar19 = uVar19 + 1;
  } while (uVar19 != 4);
  if ((bVar24) &&
     (ComputeDistanceCost(cmds,num_commands,(BrotliDistanceParams *)(ulong)uVar3,new_params_00,
                          (double *)&orig_params.dist), dist_cost < local_1c8)) {
    (params->dist).max_distance = orig_params.dist.max_distance;
    pBVar1->distance_postfix_bits = orig_params.dist.distance_postfix_bits;
    pBVar1->num_direct_distance_codes = orig_params.dist.num_direct_distance_codes;
    (params->dist).alphabet_size_max = orig_params.dist.alphabet_size_max;
    (params->dist).alphabet_size_limit = orig_params.dist.alphabet_size_limit;
  }
  if (uVar3 == pBVar1->distance_postfix_bits) {
    if ((num_commands != 0) && (uVar5 != (params->dist).num_direct_distance_codes)) {
LAB_00135171:
      puVar16 = &cmds->dist_prefix_;
      sVar15 = num_commands;
      do {
        if (((*(uint *)(puVar16 + -5) & 0x1ffffff) != 0) && (0x7f < puVar16[-1])) {
          uVar21 = *puVar16 & 0x3ff;
          if (uVar5 + 0x10 <= uVar21) {
            uVar21 = (uVar21 - uVar5) - 0x10;
            uVar21 = (uVar21 & ~(-1 << ((byte)uVar3 & 0x1f))) + uVar5 + 0x10 +
                     ((((uVar21 >> (uVar3 & 0x1f) & 1) != 0) + 2 << ((byte)(*puVar16 >> 10) & 0x1f))
                      + *(uint32_t *)(puVar16 + -3) + -4 << ((byte)uVar3 & 0x1f));
          }
          uVar14 = (ulong)uVar21;
          uVar18 = (ulong)(params->dist).num_direct_distance_codes;
          uVar12 = uVar18 + 0x10;
          if (uVar14 < uVar12) {
            uVar19 = 0;
          }
          else {
            bVar11 = (byte)pBVar1->distance_postfix_bits;
            uVar18 = ((4L << (bVar11 & 0x3f)) + (uVar14 - uVar18)) - 0x10;
            uVar21 = 0x1f;
            uVar17 = (uint)uVar18;
            if (uVar17 != 0) {
              for (; uVar17 >> uVar21 == 0; uVar21 = uVar21 - 1) {
              }
            }
            uVar21 = (uVar21 ^ 0xffffffe0) + 0x1f;
            bVar24 = (uVar18 >> ((ulong)uVar21 & 0x3f) & 1) != 0;
            iVar6 = uVar21 - pBVar1->distance_postfix_bits;
            uVar14 = (ulong)(((uint)bVar24 + iVar6 * 2 + 0xfffe << (bVar11 & 0x3f)) +
                             (int)uVar12 + (~(-1 << (bVar11 & 0x1f)) & uVar17) | iVar6 * 0x400);
            uVar19 = (uint32_t)
                     (uVar18 - ((ulong)bVar24 + 2 << ((byte)uVar21 & 0x3f)) >> (bVar11 & 0x3f));
          }
          *puVar16 = (ushort)uVar14;
          *(uint32_t *)(puVar16 + -3) = uVar19;
        }
        puVar16 = puVar16 + 8;
        sVar15 = sVar15 - 1;
      } while (sVar15 != 0);
    }
  }
  else if (num_commands != 0) goto LAB_00135171;
  dist_split = &mb->distance_split;
  BrotliSplitBlock(m,cmds,num_commands,ringbuffer,pos,mask,params,&mb->literal_split,
                   &mb->command_split,dist_split,literals_block_splits_decoder,
                   current_block_literals,cmds_block_splits_decoder,current_block_cmds);
  sVar15 = (mb->literal_split).num_types;
  if (params->disable_literal_context_modeling == 0) {
    lVar22 = 0x40;
    if (sVar15 == 0) {
      sVar15 = 0;
      context_modes = (ContextType *)0x0;
    }
    else {
      context_modes = (ContextType *)BrotliAllocate(m,sVar15 << 2);
      auVar4 = _DAT_0013b170;
      sVar15 = (mb->literal_split).num_types;
      if (sVar15 == 0) {
        sVar15 = 0;
      }
      else {
        lVar27 = sVar15 - 1;
        auVar25._8_4_ = (int)lVar27;
        auVar25._0_8_ = lVar27;
        auVar25._12_4_ = (int)((ulong)lVar27 >> 0x20);
        uVar12 = 0;
        auVar25 = auVar25 ^ _DAT_0013b170;
        auVar26 = _DAT_0013b160;
        auVar28 = _DAT_0013b0d0;
        do {
          auVar29 = auVar28 ^ auVar4;
          iVar6 = auVar25._4_4_;
          if ((bool)(~(auVar29._4_4_ == iVar6 && auVar25._0_4_ < auVar29._0_4_ ||
                      iVar6 < auVar29._4_4_) & 1)) {
            context_modes[uVar12] = literal_context_mode;
          }
          if ((auVar29._12_4_ != auVar25._12_4_ || auVar29._8_4_ <= auVar25._8_4_) &&
              auVar29._12_4_ <= auVar25._12_4_) {
            context_modes[uVar12 + 1] = literal_context_mode;
          }
          auVar29 = auVar26 ^ auVar4;
          iVar30 = auVar29._4_4_;
          if (iVar30 <= iVar6 && (iVar30 != iVar6 || auVar29._0_4_ <= auVar25._0_4_)) {
            context_modes[uVar12 + 2] = literal_context_mode;
            context_modes[uVar12 + 3] = literal_context_mode;
          }
          uVar12 = uVar12 + 4;
          lVar27 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 4;
          auVar28._8_8_ = lVar27 + 4;
          lVar27 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 4;
          auVar26._8_8_ = lVar27 + 4;
        } while ((sVar15 + 3 & 0xfffffffffffffffc) != uVar12);
      }
    }
  }
  else {
    context_modes = (ContextType *)0x0;
    lVar22 = 1;
  }
  sVar15 = sVar15 * lVar22;
  if (sVar15 == 0) {
    local_1d8 = (HistogramLiteral *)0x0;
  }
  else {
    local_1d8 = (HistogramLiteral *)BrotliAllocate(m,sVar15 * 0x410);
    sVar20 = sVar15;
    pHVar9 = local_1d8;
    do {
      memset(pHVar9,0,0x408);
      pHVar9->bit_cost_ = INFINITY;
      pHVar9 = pHVar9 + 1;
      sVar20 = sVar20 - 1;
    } while (sVar20 != 0);
  }
  lVar22 = dist_split->num_types * 4;
  if (lVar22 == 0) {
    local_1e0 = (HistogramDistance *)0x0;
  }
  else {
    local_1e0 = (HistogramDistance *)BrotliAllocate(m,dist_split->num_types * 0x2240);
    pHVar10 = local_1e0;
    do {
      memset(pHVar10,0,0x888);
      pHVar10->bit_cost_ = INFINITY;
      pHVar10 = pHVar10 + 1;
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
  }
  sVar20 = (mb->command_split).num_types;
  mb->command_histograms_size = sVar20;
  if (sVar20 == 0) {
    mb->command_histograms = (HistogramCommand *)0x0;
    insert_and_copy_histograms = (HistogramCommand *)0x0;
  }
  else {
    insert_and_copy_histograms = (HistogramCommand *)BrotliAllocate(m,sVar20 * 0xb10);
    sVar20 = mb->command_histograms_size;
    mb->command_histograms = insert_and_copy_histograms;
    if (sVar20 != 0) {
      do {
        memset(insert_and_copy_histograms,0,0xb08);
        insert_and_copy_histograms->bit_cost_ = INFINITY;
        insert_and_copy_histograms = insert_and_copy_histograms + 1;
        sVar20 = sVar20 - 1;
      } while (sVar20 != 0);
      insert_and_copy_histograms = mb->command_histograms;
    }
  }
  BrotliBuildHistogramsWithContext
            (cmds,num_commands,&mb->literal_split,&mb->command_split,dist_split,ringbuffer,pos,mask,
             prev_byte,prev_byte2,context_modes,local_1d8,insert_and_copy_histograms,local_1e0);
  BrotliFree(m,context_modes);
  sVar20 = (mb->literal_split).num_types;
  sVar7 = sVar20 << 6;
  mb->literal_context_map_size = sVar7;
  if (sVar7 == 0) {
    puVar8 = (uint32_t *)0x0;
    mb->literal_context_map = (uint32_t *)0x0;
    mb->literal_histograms_size = 0;
LAB_0013563c:
    pHVar9 = (HistogramLiteral *)0x0;
  }
  else {
    puVar8 = (uint32_t *)BrotliAllocate(m,sVar20 << 8);
    sVar20 = mb->literal_context_map_size;
    mb->literal_context_map = puVar8;
    mb->literal_histograms_size = sVar20;
    if (sVar20 == 0) goto LAB_0013563c;
    pHVar9 = (HistogramLiteral *)BrotliAllocate(m,sVar20 * 0x410);
    puVar8 = mb->literal_context_map;
  }
  mb->literal_histograms = pHVar9;
  BrotliClusterHistogramsLiteral
            (m,local_1d8,sVar15,0x100,pHVar9,&mb->literal_histograms_size,puVar8);
  BrotliFree(m,local_1d8);
  if ((params->disable_literal_context_modeling != 0) &&
     (sVar15 = (mb->literal_split).num_types, sVar15 != 0)) {
    puVar8 = mb->literal_context_map;
    puVar13 = puVar8 + sVar15 * 0x40;
    do {
      uVar3 = puVar8[sVar15 - 1];
      sVar15 = sVar15 - 1;
      lVar22 = -0x40;
      do {
        puVar2 = puVar13 + lVar22;
        *puVar2 = uVar3;
        puVar2[1] = uVar3;
        puVar2[2] = uVar3;
        puVar2[3] = uVar3;
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0);
      puVar13 = puVar13 + -0x40;
    } while (sVar15 != 0);
  }
  sVar20 = (mb->distance_split).num_types;
  sVar15 = sVar20 * 4;
  mb->distance_context_map_size = sVar15;
  if (sVar15 == 0) {
    puVar8 = (uint32_t *)0x0;
    mb->distance_context_map = (uint32_t *)0x0;
    mb->distance_histograms_size = 0;
  }
  else {
    puVar8 = (uint32_t *)BrotliAllocate(m,sVar20 << 4);
    sVar15 = mb->distance_context_map_size;
    mb->distance_context_map = puVar8;
    mb->distance_histograms_size = sVar15;
    if (sVar15 != 0) {
      pHVar10 = (HistogramDistance *)BrotliAllocate(m,sVar15 * 0x890);
      puVar8 = mb->distance_context_map;
      sVar15 = mb->distance_context_map_size;
      goto LAB_00135751;
    }
  }
  sVar15 = 0;
  pHVar10 = (HistogramDistance *)0x0;
LAB_00135751:
  mb->distance_histograms = pHVar10;
  BrotliClusterHistogramsDistance
            (m,local_1e0,sVar15,0x100,pHVar10,&mb->distance_histograms_size,puVar8);
  BrotliFree(m,local_1e0);
  return;
}

Assistant:

void BrotliBuildMetaBlock(MemoryManager* m,
                      const uint8_t* ringbuffer,
                      const size_t pos,
                      const size_t mask,
                      BrotliEncoderParams* params,
                      uint8_t prev_byte,
                      uint8_t prev_byte2,
                      Command* cmds,
                      size_t num_commands,
                      ContextType literal_context_mode,
                      const BlockSplitFromDecoder* literals_block_splits_decoder,
                      size_t* current_block_literals,
                      const BlockSplitFromDecoder* cmds_block_splits_decoder,
                      size_t* current_block_cmds,
                      MetaBlockSplit* mb) {
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliEncoderParams orig_params = *params;
  BrotliEncoderParams new_params = *params;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect);
      if (npostfix == orig_params.dist.distance_postfix_bits &&
          ndirect == orig_params.dist.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands,
          &orig_params.dist, &new_params.dist, &dist_cost);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params.dist;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands,
                        &orig_params.dist, &orig_params.dist, &dist_cost);
    if (dist_cost < best_dist_cost) {
      /* NB: currently unused; uncomment when more param tuning is added. */
      /* best_dist_cost = dist_cost; */
      params->dist = orig_params.dist;
    }
  }
  RecomputeDistancePrefixes(cmds, num_commands,
                            &orig_params.dist, &params->dist);
  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split,
                   literals_block_splits_decoder, current_block_literals,
                   cmds_block_splits_decoder, current_block_cmds);

  if (BROTLI_IS_OOM(m)) return;
  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_context_modes)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }
  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_histograms)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_histograms)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);
  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->command_histograms)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);
  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);
  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_context_map)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_histograms)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);

  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }
  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_context_map)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_histograms)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}